

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void Map_Push(Map *tree,void *str,size_t size,void *id)

{
  Map *pMVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = 0;
  sVar3 = sVar2;
  if (size != 0) {
    do {
      pMVar1 = tree->delta[*(byte *)((long)str + sVar2)];
      sVar3 = sVar2;
      if (pMVar1 == (Map *)0x0) break;
      sVar2 = sVar2 + 1;
      tree = pMVar1;
      sVar3 = size;
    } while (size != sVar2);
  }
  if (sVar3 == size) {
    if (tree->ID != (void *)0x0) {
      __assert_fail("tree->ID==NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/misc/map.c"
                    ,0x29,"void Map_Push(Map *, void *, size_t, void *)");
    }
  }
  else {
    pMVar1 = tree;
    if (sVar3 < size) {
      do {
        tree = (Map *)calloc(1,0x810);
        pMVar1->delta[*(byte *)((long)str + sVar3)] = tree;
        sVar3 = sVar3 + 1;
        pMVar1 = tree;
      } while (size != sVar3);
    }
  }
  tree->ID = id;
  tree->is_final = '\x01';
  return;
}

Assistant:

void Map_Push(Map *tree,void *str,size_t size,void *id)
{
	size_t temp;
	Map_Scour(tree,str,size,&temp,&tree);	

	if(temp == size)
	{
		assert(tree->ID==NULL);
		tree->ID=id;
		tree->is_final=1;
		return;
	}
	for(temp;temp<size;++temp)
	{
		tree=tree->delta[((unsigned char*)str)[temp]]=calloc(1,sizeof(Map));
		/*
		Map_Init(
			tree=tree->delta[((unsigned char*)str)[temp]]=malloc(sizeof(Map))
			);
			*/
	}

	tree->ID=id;
	tree->is_final=1;

}